

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktOpaqueTypeIndexingTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::anon_unknown_0::AtomicCounterIndexingCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,AtomicCounterIndexingCaseInstance *this)

{
  int iVar1;
  uint uVar2;
  pointer piVar3;
  undefined8 *puVar4;
  long lVar5;
  ulong *puVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  Handle<(vk::HandleType)22> HVar9;
  undefined1 auVar10 [16];
  Buffer *pBVar11;
  vector<bool,_std::allocator<bool>_> *__cur;
  DeviceInterface *vk;
  VkDevice device;
  pointer piVar12;
  ShaderExecutor *pSVar13;
  void *__s;
  undefined1 (*pauVar14) [16];
  long lVar15;
  InternalError *this_00;
  int *piVar16;
  undefined1 (*pauVar17) [16];
  int opNdx;
  long lVar18;
  int opNdx_1;
  long lVar19;
  ulong *puVar20;
  int iVar21;
  ulong uVar22;
  undefined1 auVar23 [8];
  uint *puVar24;
  VkDescriptorBufferInfo bufferInfo;
  value_type_conflict2 *__val;
  VkDescriptorSetLayoutCreateInfo layoutInfo;
  vector<void_*,_std::allocator<void_*>_> inputs;
  vector<int,_std::allocator<int>_> expandedIndices;
  vector<void_*,_std::allocator<void_*>_> outputs;
  MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  indexBuffer;
  VkDescriptorPoolSize poolSizes [2];
  VkDescriptorSetLayoutBinding bindings [2];
  Move<vk::Handle<(vk::HandleType)22>_> local_388;
  TestStatus *local_368;
  undefined1 (*local_360) [16];
  uint *local_358;
  undefined1 (*local_350) [16];
  undefined1 local_348 [16];
  undefined1 local_338 [24];
  string *local_320;
  undefined1 local_318 [8];
  undefined1 auStack_310 [8];
  undefined1 local_308 [16];
  undefined1 local_2f8 [8];
  undefined1 auStack_2f0 [8];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  long local_2c8;
  undefined1 local_2b8 [16];
  pointer local_2a8;
  Buffer *local_298;
  Buffer *local_290;
  undefined1 local_288 [16];
  long local_278;
  UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  local_268;
  undefined1 local_258 [8];
  undefined1 auStack_250 [8];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_210;
  uint *local_208;
  AtomicCounterIndexingCaseInstance *local_200;
  Buffer local_1f8;
  undefined1 local_1b8 [8];
  VkDevice *ppVStack_1b0;
  Buffer local_1a8;
  ios_base local_140 [272];
  
  local_2a8 = (pointer)0x0;
  local_2b8 = (undefined1  [16])0x0;
  local_2c8 = 0;
  local_2d8 = (undefined1  [16])0x0;
  local_278 = 0;
  local_288 = (undefined1  [16])0x0;
  local_368 = __return_storage_ptr__;
  local_358 = (uint *)operator_new(0x200);
  memset(local_358,0,0x200);
  vk = Context::getDeviceInterface
                 ((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.
                              m_context);
  anon_unknown_0::Buffer::Buffer
            (&local_1f8,(this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context,
             0x20,0x10);
  local_268.m_data.ptr = (Buffer *)0x0;
  local_308 = (undefined1  [16])0x0;
  _local_318 = (undefined1  [16])0x0;
  local_2e8 = (undefined1  [16])0x0;
  _local_2f8 = (undefined1  [16])0x0;
  local_228 = (undefined1  [16])0x0;
  local_238 = (undefined1  [16])0x0;
  OpaqueTypeIndexingTestInstance::checkSupported
            (&this->super_OpaqueTypeIndexingTestInstance,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER);
  *(undefined1 (*) [16])
   (local_1f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr)->m_hostPtr = (undefined1  [16])0x0;
  piVar16 = (int *)(local_1f8.m_allocation.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
                   )->m_offset;
  ::vk::flushMappedMemoryRange
            (local_1f8.m_vkd,local_1f8.m_device,
             (VkDeviceMemory)
             ((local_1f8.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,(VkDeviceSize)piVar16,0xffffffffffffffff);
  if ((this->super_OpaqueTypeIndexingTestInstance).m_indexExprType == INDEX_EXPR_TYPE_UNIFORM) {
    createUniformIndexBuffer
              ((MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
                *)local_1b8,
               (this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context,
               (int)(this->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start,piVar16);
    auVar23 = local_1b8;
    local_1b8 = (undefined1  [8])0x0;
    if (auVar23 != (undefined1  [8])0x0) {
      de::details::
      UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
      ::reset(&local_268);
      local_268.m_data.ptr = (Buffer *)auVar23;
    }
    de::details::
    UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
    ::reset((UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
             *)local_1b8);
  }
  else {
    auVar23 = (undefined1  [8])0x0;
  }
  local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       0x7fffffff00000001;
  local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_1a8.m_vkd = (DeviceInterface *)0x0;
  local_1a8.m_device = (VkDevice)0x600000001;
  local_1b8 = (undefined1  [8])0x700000000;
  ppVStack_1b0 = (VkDevice *)0x7fffffff00000001;
  local_348._0_4_ = 0x20;
  local_348._8_8_ = 0;
  local_338._8_8_ = local_1b8;
  local_338._0_8_ = 0x200000000;
  ::vk::createDescriptorSetLayout
            ((Move<vk::Handle<(vk::HandleType)19>_> *)local_258,vk,device,
             (VkDescriptorSetLayoutCreateInfo *)local_348,(VkAllocationCallbacks *)0x0);
  auVar10 = local_248;
  auVar8 = _local_258;
  local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)local_248._0_8_;
  local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
       local_248._8_8_;
  local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
       (deUint64)local_258;
  local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)auStack_250;
  _local_258 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  if ((VkDescriptorPoolSize)local_318 == (VkDescriptorPoolSize)0x0) {
    local_308 = auVar10;
    _local_318 = auVar8;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)19>_> *)(local_318 + 8),
               (VkDescriptorSetLayout)local_318);
    auStack_310 = (undefined1  [8])
                  local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                  m_deviceIface;
    local_318 = (undefined1  [8])
                local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    local_308._8_8_ =
         local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal;
    local_308._0_8_ =
         local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
    if (local_258 != (undefined1  [8])0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)19>_> *)(local_258 + 8),
                 (VkDescriptorSetLayout)local_258);
    }
  }
  auStack_250 = (undefined1  [8])0x100000006;
  local_258 = (undefined1  [8])0x100000007;
  local_1b8._0_4_ = 0x21;
  ppVStack_1b0 = (VkDevice *)0x0;
  local_1a8.m_vkd = (DeviceInterface *)0x100000001;
  local_1a8.m_device = (VkDevice)CONCAT44(local_1a8.m_device._4_4_,2);
  local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       (deUint64)local_258;
  ::vk::createDescriptorPool
            ((Move<vk::Handle<(vk::HandleType)21>_> *)local_348,vk,device,
             (VkDescriptorPoolCreateInfo *)local_1b8,(VkAllocationCallbacks *)0x0);
  auVar10 = local_338._0_16_;
  auVar8 = local_348;
  local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)local_338._0_8_;
  local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
       local_338._8_8_;
  local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
       local_348._0_8_;
  local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_348._8_8_;
  local_348 = (undefined1  [16])0x0;
  local_338._0_16_ = (undefined1  [16])0x0;
  if (local_2f8 == (undefined1  [8])0x0) {
    local_2e8 = auVar10;
    _local_2f8 = auVar8;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)21>_> *)(local_2f8 + 8),
               (VkDescriptorPool)local_2f8);
    auStack_2f0 = (undefined1  [8])
                  local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                  m_deviceIface;
    local_2f8 = (undefined1  [8])
                local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    local_2e8._8_8_ =
         local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal;
    local_2e8._0_8_ =
         local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
    if (local_348._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)21>_> *)(local_348 + 8),
                 (VkDescriptorPool)local_348._0_8_);
    }
  }
  local_1b8._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  ppVStack_1b0 = (VkDevice *)0x0;
  local_1a8.m_vkd = (DeviceInterface *)local_2f8;
  local_1a8.m_device = (VkDevice)CONCAT44(local_1a8.m_device._4_4_,1);
  local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       (deUint64)local_318;
  ::vk::allocateDescriptorSet(&local_388,vk,device,(VkDescriptorSetAllocateInfo *)local_1b8);
  HVar9.m_internal =
       local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
  local_238._8_8_ =
       local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface;
  local_238._0_8_ =
       local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
  local_228._8_4_ =
       (undefined4)
       local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal;
  local_228._0_8_ = local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device
  ;
  local_228._12_4_ =
       local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal.
       _4_4_;
  local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
       local_1f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)0xffffffffffffffff;
  local_1b8._0_4_ = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
  ppVStack_1b0 = (VkDevice *)0x0;
  local_1a8.m_vkd = (DeviceInterface *)HVar9.m_internal;
  local_1a8.m_device = (VkDevice)0x0;
  local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       0x700000001;
  local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)&local_388;
  (*vk->_vptr_DeviceInterface[0x3e])(vk,device,1,local_1b8,0,0);
  if (auVar23 != (undefined1  [8])0x0) {
    local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
         (((Buffer *)auVar23)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object
         .m_internal;
    local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
         (VkDevice)0xffffffffffffffff;
    local_1b8._0_4_ = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
    ppVStack_1b0 = (VkDevice *)0x0;
    local_1a8.m_vkd = (DeviceInterface *)HVar9.m_internal;
    local_1a8.m_device = (VkDevice)&DAT_00000001;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         0x600000001;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    local_1a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)&local_388;
    (*vk->_vptr_DeviceInterface[0x3e])(vk,device,1,local_1b8,0,0);
  }
  local_298 = (Buffer *)HVar9.m_internal;
  if ((this->super_OpaqueTypeIndexingTestInstance).m_indexExprType ==
      INDEX_EXPR_TYPE_DYNAMIC_UNIFORM) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_2b8,
               ((long)(this->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start) * 8);
    piVar3 = (this->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar18 = 0;
    piVar12 = (pointer)local_2b8._0_8_;
    do {
      iVar1 = piVar3[lVar18];
      lVar19 = 0;
      do {
        piVar16 = piVar12 + lVar19;
        *piVar16 = iVar1;
        piVar16[1] = iVar1;
        piVar16[2] = iVar1;
        piVar16[3] = iVar1;
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0x20);
      lVar18 = lVar18 + 1;
      piVar12 = piVar12 + 0x20;
    } while (lVar18 != 4);
    lVar18 = 0;
    do {
      local_1b8 = (undefined1  [8])(local_2b8._0_8_ + lVar18);
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)local_2d8,(void **)local_1b8);
      lVar18 = lVar18 + 0x80;
    } while (lVar18 != 0x200);
  }
  lVar18 = 0;
  do {
    local_1b8 = (undefined1  [8])((long)local_358 + lVar18);
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)local_288,(void **)local_1b8);
    lVar18 = lVar18 + 0x80;
  } while (lVar18 != 0x200);
  pSVar13 = createExecutor((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context
                           ,(this->super_OpaqueTypeIndexingTestInstance).m_shaderType,
                           (this->super_OpaqueTypeIndexingTestInstance).m_shaderSpec,
                           (VkDescriptorSetLayout)local_318);
  lVar18 = 0;
  if (local_2d8._0_8_ != local_2d8._8_8_) {
    lVar18 = local_2d8._0_8_;
  }
  (*pSVar13->_vptr_ShaderExecutor[2])(pSVar13,0x20,lVar18,local_288._0_8_,local_298);
  (*pSVar13->_vptr_ShaderExecutor[1])(pSVar13);
  local_290 = (Buffer *)
              ((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context)->m_testCtx
              ->m_log;
  local_1b8 = (undefined1  [8])&local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Pass","");
  local_368->m_code = QP_TEST_RESULT_PASS;
  local_320 = (string *)&local_368->m_description;
  local_210 = &(local_368->m_description).field_2;
  (local_368->m_description)._M_dataplus._M_p = (pointer)local_210;
  std::__cxx11::string::_M_construct<char*>
            (local_320,local_1b8,(undefined1 *)((long)ppVStack_1b0 + (long)local_1b8));
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,(ulong)((long)local_1a8.m_vkd + 1));
  }
  local_360 = (undefined1 (*) [16])operator_new(0x10);
  *local_360 = (undefined1  [16])0x0;
  local_350 = (undefined1 (*) [16])operator_new(0x10);
  *local_350 = (undefined1  [16])0x0;
  local_348 = (undefined1  [16])0x0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_338._8_8_;
  local_338._0_16_ = auVar8 << 0x40;
  __s = operator_new(0xa0);
  local_348._0_8_ = __s;
  local_338._0_8_ = (long)__s + 0xa0;
  lVar18 = 0;
  memset(__s,0,0xa0);
  local_348._8_8_ = (long)__s + 0xa0;
  piVar3 = (this->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  do {
    *(int *)(*local_360 + (long)piVar3[lVar18] * 4) =
         *(int *)(*local_360 + (long)piVar3[lVar18] * 4) + 1;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 4);
  puVar4 = (undefined8 *)
           (local_1f8.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr;
  local_200 = this;
  ::vk::invalidateMappedMemoryRange
            (local_1f8.m_vkd,local_1f8.m_device,
             (VkDeviceMemory)
             ((local_1f8.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (local_1f8.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,0xffffffffffffffff);
  uVar7 = puVar4[1];
  *(undefined8 *)*local_350 = *puVar4;
  *(undefined8 *)(*local_350 + 8) = uVar7;
  lVar18 = 0;
  pauVar14 = local_360;
  pauVar17 = local_350;
  do {
    if (*(int *)(*pauVar14 + lVar18 * 4) << 5 != *(int *)(*pauVar17 + lVar18 * 4)) {
      local_1b8 = (undefined1  [8])local_290;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ppVStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&ppVStack_1b0,"ERROR: atomic counter ",0x16);
      std::ostream::operator<<((ostringstream *)&ppVStack_1b0,(int)lVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ppVStack_1b0," has value ",0xb)
      ;
      std::ostream::_M_insert<unsigned_long>((ulong)&ppVStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ppVStack_1b0,", expected ",0xb)
      ;
      std::ostream::_M_insert<unsigned_long>((ulong)&ppVStack_1b0);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ppVStack_1b0);
      std::ios_base::~ios_base(local_140);
      pauVar14 = local_360;
      pauVar17 = local_350;
      if (local_368->m_code == QP_TEST_RESULT_PASS) {
        local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
             (deUint64)
             &local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_388,"Invalid atomic counter value","");
        local_1b8._0_4_ = 1;
        ppVStack_1b0 = &local_1a8.m_device;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&ppVStack_1b0,
                   local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal
                   ,(long)&(local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                           m_deviceIface)->_vptr_DeviceInterface +
                    local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                    m_internal);
        local_368->m_code = local_1b8._0_4_;
        std::__cxx11::string::operator=(local_320,(string *)&ppVStack_1b0);
        if (ppVStack_1b0 != &local_1a8.m_device) {
          operator_delete(ppVStack_1b0,(ulong)(local_1a8.m_device + 1));
        }
        pauVar14 = local_360;
        pauVar17 = local_350;
        if ((VkDevice *)
            local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal !=
            &local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device) {
          operator_delete((void *)local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                                  object.m_internal,
                          (ulong)(local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                                  deleter.m_device + 1));
          pauVar14 = local_360;
          pauVar17 = local_350;
        }
      }
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 4);
  lVar18 = 0;
  do {
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)(local_348._0_8_ + lVar18),
               (long)(*(int *)*pauVar14 << 5),false);
    pauVar14 = (undefined1 (*) [16])(*pauVar14 + 4);
    lVar18 = lVar18 + 0x28;
  } while (lVar18 != 0xa0);
  lVar18 = 0;
  puVar24 = local_358;
  do {
    lVar19 = 0;
    local_208 = puVar24;
    do {
      lVar15 = (long)(local_200->m_opIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                     .super__Vector_impl_data._M_start[lVar19];
      uVar2 = *puVar24;
      lVar5 = *(long *)(local_348._0_8_ + lVar15 * 0x28);
      if (uVar2 < (uint)((*(int *)(local_348._0_8_ + 0x10 + lVar15 * 0x28) - (int)lVar5) * 8 +
                        *(int *)(local_348._0_8_ + 0x18 + lVar15 * 0x28))) {
        uVar22 = *(ulong *)(lVar5 + (ulong)(uVar2 >> 6) * 8);
        if ((uVar22 >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_009d70b5;
        *(ulong *)(lVar5 + (ulong)(uVar2 >> 6) * 8) = uVar22 | 1L << ((byte)uVar2 & 0x3f);
      }
      else {
LAB_009d70b5:
        local_1b8 = (undefined1  [8])local_290;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ppVStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&ppVStack_1b0,"ERROR: at invocation ",0x15);
        std::ostream::operator<<((ostringstream *)&ppVStack_1b0,(int)lVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ppVStack_1b0,", op ",5);
        std::ostream::operator<<((ostringstream *)&ppVStack_1b0,(int)lVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&ppVStack_1b0,": got invalid result value ",0x1b);
        std::ostream::_M_insert<unsigned_long>((ulong)&ppVStack_1b0);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ppVStack_1b0);
        std::ios_base::~ios_base(local_140);
        if (local_368->m_code == QP_TEST_RESULT_PASS) {
          local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
               (deUint64)
               &local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_388,"Invalid result value","");
          local_1b8._0_4_ = 1;
          ppVStack_1b0 = &local_1a8.m_device;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&ppVStack_1b0,
                     local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                     m_internal,
                     (long)&(local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
                            .m_deviceIface)->_vptr_DeviceInterface +
                     local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
                     m_internal);
          local_368->m_code = local_1b8._0_4_;
          std::__cxx11::string::operator=(local_320,(string *)&ppVStack_1b0);
          if (ppVStack_1b0 != &local_1a8.m_device) {
            operator_delete(ppVStack_1b0,(ulong)(local_1a8.m_device + 1));
          }
          if ((VkDevice *)
              local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal !=
              &local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device) {
            operator_delete((void *)local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                                    object.m_internal,
                            (ulong)(local_388.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                                    deleter.m_device + 1));
          }
        }
      }
      pBVar11 = local_298;
      lVar19 = lVar19 + 1;
      puVar24 = puVar24 + 0x20;
    } while (lVar19 != 4);
    lVar18 = lVar18 + 1;
    puVar24 = local_208 + 1;
    if (lVar18 == 0x20) {
      if (local_368->m_code == QP_TEST_RESULT_PASS) {
        lVar18 = 0;
        do {
          puVar20 = *(ulong **)(local_348._0_8_ + lVar18 * 0x28);
          puVar6 = *(ulong **)(local_348._0_8_ + 0x10 + lVar18 * 0x28);
          iVar1 = *(int *)(local_348._0_8_ + 0x18 + lVar18 * 0x28);
          if (iVar1 != 0 || puVar20 != puVar6) {
            uVar22 = 0;
            do {
              if ((*puVar20 >> (uVar22 & 0x3f) & 1) == 0) {
                this_00 = (InternalError *)__cxa_allocate_exception(0x38);
                tcu::InternalError::InternalError
                          (this_00,(char *)0x0,"*i",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktOpaqueTypeIndexingTests.cpp"
                           ,0x716);
                __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
              }
              iVar21 = (int)uVar22;
              uVar22 = (ulong)(iVar21 + 1);
              if (iVar21 == 0x3f) {
                uVar22 = 0;
              }
              puVar20 = puVar20 + (iVar21 == 0x3f);
            } while ((int)uVar22 != iVar1 || puVar20 != puVar6);
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 != 4);
      }
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 *)local_348);
      operator_delete(local_350,0x10);
      operator_delete(local_360,0x10);
      if (pBVar11 != (Buffer *)0x0) {
        local_1b8 = (undefined1  [8])pBVar11;
        (**(code **)(*(long *)local_238._8_8_ + 0x1e8))
                  (local_238._8_8_,local_228._0_8_,local_228._8_8_,1);
      }
      if (local_2f8 != (undefined1  [8])0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)21>_> *)(local_2f8 + 8),
                   (VkDescriptorPool)local_2f8);
      }
      if ((VkDescriptorPoolSize)local_318 != (VkDescriptorPoolSize)0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)19>_> *)(local_318 + 8),
                   (VkDescriptorSetLayout)local_318);
      }
      de::details::
      UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
      ::reset(&local_268);
      if (local_1f8.m_allocation.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
          (Allocation *)0x0) {
        (*(local_1f8.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
          _vptr_Allocation[1])();
        local_1f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
        .m_data.ptr = (Allocation *)0x0;
      }
      if (local_1f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
          != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  (&local_1f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                   (VkBuffer)
                   local_1f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                   m_internal);
      }
      operator_delete(local_358,0x200);
      if ((void *)local_288._0_8_ != (void *)0x0) {
        operator_delete((void *)local_288._0_8_,local_278 - local_288._0_8_);
      }
      if ((void *)local_2d8._0_8_ != (void *)0x0) {
        operator_delete((void *)local_2d8._0_8_,local_2c8 - local_2d8._0_8_);
      }
      if ((pointer)local_2b8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2b8._0_8_,(long)local_2a8 - local_2b8._0_8_);
      }
      return local_368;
    }
  } while( true );
}

Assistant:

tcu::TestStatus AtomicCounterIndexingCaseInstance::iterate (void)
{
	// \todo [2015-12-02 elecro] Add vertexPipelineStoresAndAtomics feature check.
	const int					numInvocations		= NUM_INVOCATIONS;
	const int					numCounters			= NUM_COUNTERS;
	const int					numOps				= NUM_OPS;
	std::vector<int>			expandedIndices;
	std::vector<void*>			inputs;
	std::vector<void*>			outputs;
	std::vector<deUint32>		outValues			(numInvocations*numOps);

	const DeviceInterface&		vkd					= m_context.getDeviceInterface();
	const VkDevice				device				= m_context.getDevice();

	// \note Using separate buffer per element - might want to test
	// offsets & single buffer in the future.
	Buffer						atomicOpBuffer		(m_context, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT, sizeof(deUint32)*numCounters);
	MovePtr<Buffer>				indexBuffer;

	Move<VkDescriptorSetLayout>	extraResourcesLayout;
	Move<VkDescriptorPool>		extraResourcesSetPool;
	Move<VkDescriptorSet>		extraResourcesSet;

	checkSupported(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER);

	deMemset(atomicOpBuffer.getHostPtr(), 0, sizeof(deUint32)*numCounters);
	atomicOpBuffer.flush();

	if (m_indexExprType == INDEX_EXPR_TYPE_UNIFORM)
		indexBuffer = createUniformIndexBuffer(m_context, numOps, &m_opIndices[0]);

	{
		const VkDescriptorSetLayoutBinding		bindings[]	=
		{
			{ 0u,	VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,	1u,	VK_SHADER_STAGE_ALL,	DE_NULL		},
			{ 1u,	VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,	1u,	VK_SHADER_STAGE_ALL,	DE_NULL		}
		};
		const VkDescriptorSetLayoutCreateInfo	layoutInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
			DE_NULL,
			(VkDescriptorSetLayoutCreateFlags)0u,
			DE_LENGTH_OF_ARRAY(bindings),
			bindings,
		};

		extraResourcesLayout = createDescriptorSetLayout(vkd, device, &layoutInfo);
	}

	{
		const VkDescriptorPoolSize			poolSizes[]	=
		{
			{ VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,	1u,	},
			{ VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,	1u,	}
		};
		const VkDescriptorPoolCreateInfo	poolInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			(VkDescriptorPoolCreateFlags)VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,
			1u,		// maxSets
			DE_LENGTH_OF_ARRAY(poolSizes),
			poolSizes,
		};

		extraResourcesSetPool = createDescriptorPool(vkd, device, &poolInfo);
	}

	{
		const VkDescriptorSetAllocateInfo	allocInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,
			*extraResourcesSetPool,
			1u,
			&extraResourcesLayout.get(),
		};

		extraResourcesSet = allocateDescriptorSet(vkd, device, &allocInfo);
	}

	{
		const VkDescriptorBufferInfo	bufferInfo			=
		{
			atomicOpBuffer.getBuffer(),
			0u,
			VK_WHOLE_SIZE
		};
		const VkWriteDescriptorSet		descriptorWrite		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
			DE_NULL,
			*extraResourcesSet,
			0u,		// dstBinding
			0u,		// dstArrayElement
			1u,
			VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
			(const VkDescriptorImageInfo*)DE_NULL,
			&bufferInfo,
			(const VkBufferView*)DE_NULL,
		};

		vkd.updateDescriptorSets(device, 1u, &descriptorWrite, 0u, DE_NULL);
	}

	if (indexBuffer)
	{
		const VkDescriptorBufferInfo	bufferInfo	=
		{
			indexBuffer->getBuffer(),
			0u,
			VK_WHOLE_SIZE
		};
		const VkWriteDescriptorSet		descriptorWrite		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
			DE_NULL,
			*extraResourcesSet,
			1u,		// dstBinding
			0u,		// dstArrayElement
			1u,
			VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
			(const VkDescriptorImageInfo*)DE_NULL,
			&bufferInfo,
			(const VkBufferView*)DE_NULL,
		};

		vkd.updateDescriptorSets(device, 1u, &descriptorWrite, 0u, DE_NULL);
	}

	if (m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM)
	{
		expandedIndices.resize(numInvocations * m_opIndices.size());

		for (int opNdx = 0; opNdx < numOps; opNdx++)
		{
			int* dst = &expandedIndices[numInvocations*opNdx];
			std::fill(dst, dst+numInvocations, m_opIndices[opNdx]);
		}

		for (int opNdx = 0; opNdx < numOps; opNdx++)
			inputs.push_back(&expandedIndices[opNdx*numInvocations]);
	}

	for (int opNdx = 0; opNdx < numOps; opNdx++)
		outputs.push_back(&outValues[opNdx*numInvocations]);

	{
		UniquePtr<ShaderExecutor>	executor	(createExecutor(m_context, m_shaderType, m_shaderSpec, *extraResourcesLayout));

		executor->execute(numInvocations, inputs.empty() ? DE_NULL : &inputs[0], &outputs[0], *extraResourcesSet);
	}

	{
		tcu::TestLog&					log				= m_context.getTestContext().getLog();
		tcu::TestStatus					testResult		= tcu::TestStatus::pass("Pass");
		std::vector<int>				numHits			(numCounters, 0);	// Number of hits per counter.
		std::vector<deUint32>			counterValues	(numCounters);
		std::vector<std::vector<bool> >	counterMasks	(numCounters);

		for (int opNdx = 0; opNdx < numOps; opNdx++)
			numHits[m_opIndices[opNdx]] += 1;

		// Read counter values
		{
			const void* mapPtr = atomicOpBuffer.getHostPtr();
			DE_ASSERT(mapPtr != DE_NULL);
			atomicOpBuffer.invalidate();
			std::copy((const deUint32*)mapPtr, (const deUint32*)mapPtr + numCounters, &counterValues[0]);
		}

		// Verify counter values
		for (int counterNdx = 0; counterNdx < numCounters; counterNdx++)
		{
			const deUint32		refCount	= (deUint32)(numHits[counterNdx]*numInvocations);
			const deUint32		resCount	= counterValues[counterNdx];

			if (refCount != resCount)
			{
				log << tcu::TestLog::Message << "ERROR: atomic counter " << counterNdx << " has value " << resCount
					<< ", expected " << refCount
					<< tcu::TestLog::EndMessage;

				if (testResult.getCode() == QP_TEST_RESULT_PASS)
					testResult = tcu::TestStatus::fail("Invalid atomic counter value");
			}
		}

		// Allocate bitmasks - one bit per each valid result value
		for (int counterNdx = 0; counterNdx < numCounters; counterNdx++)
		{
			const int	counterValue	= numHits[counterNdx]*numInvocations;
			counterMasks[counterNdx].resize(counterValue, false);
		}

		// Verify result values from shaders
		for (int invocationNdx = 0; invocationNdx < numInvocations; invocationNdx++)
		{
			for (int opNdx = 0; opNdx < numOps; opNdx++)
			{
				const int		counterNdx	= m_opIndices[opNdx];
				const deUint32	resValue	= outValues[opNdx*numInvocations + invocationNdx];
				const bool		rangeOk		= de::inBounds(resValue, 0u, (deUint32)counterMasks[counterNdx].size());
				const bool		notSeen		= rangeOk && !counterMasks[counterNdx][resValue];
				const bool		isOk		= rangeOk && notSeen;

				if (!isOk)
				{
					log << tcu::TestLog::Message << "ERROR: at invocation " << invocationNdx
						<< ", op " << opNdx << ": got invalid result value "
						<< resValue
						<< tcu::TestLog::EndMessage;

					if (testResult.getCode() == QP_TEST_RESULT_PASS)
						testResult = tcu::TestStatus::fail("Invalid result value");
				}
				else
				{
					// Mark as used - no other invocation should see this value from same counter.
					counterMasks[counterNdx][resValue] = true;
				}
			}
		}

		if (testResult.getCode() == QP_TEST_RESULT_PASS)
		{
			// Consistency check - all masks should be 1 now
			for (int counterNdx = 0; counterNdx < numCounters; counterNdx++)
			{
				for (std::vector<bool>::const_iterator i = counterMasks[counterNdx].begin(); i != counterMasks[counterNdx].end(); i++)
					TCU_CHECK_INTERNAL(*i);
			}
		}

		return testResult;
	}
}